

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_vector_quantity.cpp
# Opt level: O3

void __thiscall
polyscope::VolumeMeshVectorQuantity::VolumeMeshVectorQuantity
          (VolumeMeshVectorQuantity *this,string *name,VolumeMesh *mesh_,
          VolumeMeshElement definedOn_)

{
  pointer pcVar1;
  string local_48;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + name->_M_string_length);
  VolumeMeshQuantity::VolumeMeshQuantity((VolumeMeshQuantity *)this,&local_48,mesh_,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  *(undefined ***)this = &PTR__Quantity_005f5e58;
  this->definedOn = definedOn_;
  return;
}

Assistant:

VolumeMeshVectorQuantity::VolumeMeshVectorQuantity(std::string name, VolumeMesh& mesh_, VolumeMeshElement definedOn_)
    : VolumeMeshQuantity(name, mesh_), definedOn(definedOn_) {}